

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_verify_traces.c
# Opt level: O2

int main(int argc,char **argv)

{
  gap_score_t gVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  int *piVar7;
  parasail_sequences_t *sequences;
  parasail_matrix_t *matrix_;
  ushort **ppuVar8;
  size_t sVar9;
  long lVar10;
  char *pcVar11;
  unsigned_long pair_limit_;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  parasail_function_group_t f;
  parasail_function_group_t f_00;
  parasail_function_group_t f_01;
  parasail_function_group_t f_02;
  parasail_function_group_t f_03;
  parasail_function_group_t f_04;
  parasail_function_group_t f_05;
  parasail_function_group_t f_06;
  parasail_function_group_t f_07;
  parasail_function_group_t f_08;
  parasail_function_group_t f_09;
  parasail_function_group_t f_10;
  parasail_function_group_t f_11;
  parasail_function_group_t f_12;
  parasail_function_group_t f_13;
  parasail_function_group_t f_14;
  parasail_function_group_t f_15;
  parasail_function_group_t f_16;
  parasail_function_group_t f_17;
  parasail_function_group_t f_18;
  parasail_function_group_t f_19;
  parasail_function_group_t f_20;
  parasail_function_group_t f_21;
  parasail_function_group_t f_22;
  parasail_function_group_t f_23;
  parasail_function_group_t f_24;
  parasail_function_group_t f_25;
  parasail_function_group_t f_26;
  parasail_function_group_t f_27;
  parasail_function_group_t f_28;
  parasail_function_group_t f_29;
  parasail_function_group_t f_30;
  parasail_function_group_t f_31;
  parasail_function_group_t f_32;
  parasail_function_group_t f_33;
  parasail_function_group_t f_34;
  parasail_function_group_t f_35;
  parasail_function_group_t f_36;
  parasail_function_group_t f_37;
  parasail_function_group_t f_38;
  parasail_function_group_t f_39;
  parasail_function_group_t f_40;
  parasail_function_group_t f_41;
  parasail_function_group_t f_42;
  parasail_function_group_t f_43;
  parasail_function_group_t f_44;
  parasail_function_group_t f_45;
  parasail_function_group_t f_46;
  parasail_function_group_t f_47;
  parasail_function_group_t f_48;
  parasail_function_group_t f_49;
  parasail_function_group_t f_50;
  size_t sStack_90;
  long local_80;
  char *endptr;
  char *local_50;
  char *local_48;
  ulong local_40;
  ulong local_38;
  
  endptr = (char *)0x0;
  local_80 = 0x80000000;
  local_38 = 0;
  local_50 = (char *)0x0;
  local_48 = (char *)0x0;
  local_40 = 0x80000000;
  bVar13 = true;
  bVar17 = bVar13;
  bVar18 = bVar13;
  bVar19 = bVar13;
  bVar14 = bVar13;
  bVar15 = bVar13;
  bVar16 = bVar13;
  bVar4 = true;
LAB_0012f316:
  bVar2 = bVar4;
  iVar5 = getopt(argc,argv,"f:m:n:o:e:vSi:E");
  sVar9 = local_38;
  uVar3 = _optopt;
  pcVar11 = _optarg;
  bVar4 = bVar2;
  switch(iVar5) {
  case 0x65:
    piVar7 = __errno_location();
    *piVar7 = 0;
    local_80 = strtol(_optarg,&endptr,10);
    if (*piVar7 != 0) {
      pcVar11 = "strtol gap.extend";
      goto LAB_0012fdce;
    }
    goto LAB_0012f316;
  case 0x66:
    local_50 = _optarg;
    goto LAB_0012f316;
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
switchD_0012f336_caseD_67:
    pcVar11 = "default case in getopt\n";
    sStack_90 = 0x17;
    break;
  case 0x69:
    pcVar6 = strstr(_optarg,"sse2");
    bVar13 = pcVar6 == (char *)0x0;
    pcVar6 = strstr(pcVar11,"sse41");
    bVar14 = pcVar6 == (char *)0x0;
    pcVar6 = strstr(pcVar11,"avx2");
    bVar15 = pcVar6 == (char *)0x0;
    pcVar6 = strstr(pcVar11,"disp");
    bVar16 = pcVar6 == (char *)0x0;
    pcVar6 = strstr(pcVar11,"nw");
    bVar17 = pcVar6 == (char *)0x0;
    pcVar6 = strstr(pcVar11,"sg");
    bVar18 = pcVar6 == (char *)0x0;
    pcVar11 = strstr(pcVar11,"sw");
    bVar19 = pcVar11 == (char *)0x0;
    goto LAB_0012f316;
  case 0x6d:
    local_48 = _optarg;
    goto LAB_0012f316;
  case 0x6e:
    piVar7 = __errno_location();
    *piVar7 = 0;
    local_38 = strtol(_optarg,&endptr,10);
    if (*piVar7 != 0) {
      pcVar11 = "strtol";
      goto LAB_0012fdce;
    }
    goto LAB_0012f316;
  case 0x6f:
    goto switchD_0012f336_caseD_6f;
  default:
    if (iVar5 == 0x45) {
      exit_on_mismatch = 1;
      goto LAB_0012f316;
    }
    bVar4 = false;
    if (iVar5 == 0x53) goto LAB_0012f316;
    if (iVar5 == 0x76) {
      verbose = 1;
      bVar4 = bVar2;
      goto LAB_0012f316;
    }
    if (iVar5 != -1) {
      if (iVar5 != 0x3f) goto switchD_0012f336_caseD_67;
      lVar10 = (long)(int)_optopt;
      if ((_optopt & 0xfffffff7) == 0x66) {
        pcVar11 = "Option -%c requires an argument.\n";
      }
      else {
        ppuVar8 = __ctype_b_loc();
        pcVar11 = "Unknown option `-%c\'.\n";
        if ((*(byte *)((long)*ppuVar8 + lVar10 * 2 + 1) & 0x40) == 0) {
          pcVar11 = "Unknown option character `\\x%x\'.\n";
        }
      }
      fprintf(_stderr,pcVar11,(ulong)uVar3);
      goto LAB_0012fe07;
    }
    if (local_50 == (char *)0x0) {
      pcVar11 = "no filename specified\n";
      sStack_90 = 0x16;
    }
    else {
      sequences = (parasail_sequences_t *)parasail_sequences_from_file();
      if (sVar9 == 0) {
        sVar9 = sequences->l;
      }
      if (local_48 == (char *)0x0) {
        matrix_ = (parasail_matrix_t *)0x0;
LAB_0012f567:
        pair_limit_ = 0;
        if (1 < sVar9) {
          pair_limit_ = (sVar9 - 1) * sVar9 >> 1;
        }
        printf("%lu choose 2 is %lu\n",sVar9,pair_limit_);
        uVar12 = local_40 & 0xffffffff;
        if ((bVar13) && (iVar5 = parasail_can_use_sse2(), bVar2 && iVar5 != 0)) {
          if (bVar17) {
            f.fs = parasail_nw_trace_sse2_functions;
            f.name = "parasail_nw_trace_sse2";
            check_functions(f,sequences,pair_limit_,matrix_,
                            (gap_score_t)((local_80 << 0x20) + uVar12));
          }
          if (bVar18) {
            gVar1 = (gap_score_t)((local_80 << 0x20) + uVar12);
            f_00.fs = parasail_sg_trace_sse2_functions;
            f_00.name = "parasail_sg_trace_sse2";
            check_functions(f_00,sequences,pair_limit_,matrix_,gVar1);
            f_01.fs = parasail_sg_qb_trace_sse2_functions;
            f_01.name = "parasail_sg_qb_trace_sse2";
            check_functions(f_01,sequences,pair_limit_,matrix_,gVar1);
            f_02.fs = parasail_sg_qe_trace_sse2_functions;
            f_02.name = "parasail_sg_qe_trace_sse2";
            check_functions(f_02,sequences,pair_limit_,matrix_,gVar1);
            f_03.fs = parasail_sg_qx_trace_sse2_functions;
            f_03.name = "parasail_sg_qx_trace_sse2";
            check_functions(f_03,sequences,pair_limit_,matrix_,gVar1);
            f_04.fs = parasail_sg_db_trace_sse2_functions;
            f_04.name = "parasail_sg_db_trace_sse2";
            check_functions(f_04,sequences,pair_limit_,matrix_,gVar1);
            f_05.fs = parasail_sg_de_trace_sse2_functions;
            f_05.name = "parasail_sg_de_trace_sse2";
            check_functions(f_05,sequences,pair_limit_,matrix_,gVar1);
            f_06.fs = parasail_sg_dx_trace_sse2_functions;
            f_06.name = "parasail_sg_dx_trace_sse2";
            check_functions(f_06,sequences,pair_limit_,matrix_,gVar1);
            f_07.fs = parasail_sg_qb_de_trace_sse2_functions;
            f_07.name = "parasail_sg_qb_de_trace_sse2";
            check_functions(f_07,sequences,pair_limit_,matrix_,gVar1);
            f_08.fs = parasail_sg_qe_db_trace_sse2_functions;
            f_08.name = "parasail_sg_qe_db_trace_sse2";
            check_functions(f_08,sequences,pair_limit_,matrix_,gVar1);
            f_09.fs = parasail_sg_qb_db_trace_sse2_functions;
            f_09.name = "parasail_sg_qb_db_trace_sse2";
            check_functions(f_09,sequences,pair_limit_,matrix_,gVar1);
            f_10.fs = parasail_sg_qe_de_trace_sse2_functions;
            f_10.name = "parasail_sg_qe_de_trace_sse2";
            check_functions(f_10,sequences,pair_limit_,matrix_,gVar1);
          }
          if (bVar19) {
            f_11.fs = parasail_sw_trace_sse2_functions;
            f_11.name = "parasail_sw_trace_sse2";
            check_functions(f_11,sequences,pair_limit_,matrix_,
                            (gap_score_t)((local_80 << 0x20) + uVar12));
          }
        }
        if ((bVar14) && (iVar5 = parasail_can_use_sse41(), bVar2 && iVar5 != 0)) {
          if (bVar17) {
            f_12.fs = parasail_nw_trace_sse41_functions;
            f_12.name = "parasail_nw_trace_sse41";
            check_functions(f_12,sequences,pair_limit_,matrix_,
                            (gap_score_t)((local_80 << 0x20) + uVar12));
          }
          if (bVar18) {
            gVar1 = (gap_score_t)((local_80 << 0x20) + uVar12);
            f_13.fs = parasail_sg_trace_sse41_functions;
            f_13.name = "parasail_sg_trace_sse41";
            check_functions(f_13,sequences,pair_limit_,matrix_,gVar1);
            f_14.fs = parasail_sg_qb_trace_sse41_functions;
            f_14.name = "parasail_sg_qb_trace_sse41";
            check_functions(f_14,sequences,pair_limit_,matrix_,gVar1);
            f_15.fs = parasail_sg_qe_trace_sse41_functions;
            f_15.name = "parasail_sg_qe_trace_sse41";
            check_functions(f_15,sequences,pair_limit_,matrix_,gVar1);
            f_16.fs = parasail_sg_qx_trace_sse41_functions;
            f_16.name = "parasail_sg_qx_trace_sse41";
            check_functions(f_16,sequences,pair_limit_,matrix_,gVar1);
            f_17.fs = parasail_sg_db_trace_sse41_functions;
            f_17.name = "parasail_sg_db_trace_sse41";
            check_functions(f_17,sequences,pair_limit_,matrix_,gVar1);
            f_18.fs = parasail_sg_de_trace_sse41_functions;
            f_18.name = "parasail_sg_de_trace_sse41";
            check_functions(f_18,sequences,pair_limit_,matrix_,gVar1);
            f_19.fs = parasail_sg_dx_trace_sse41_functions;
            f_19.name = "parasail_sg_dx_trace_sse41";
            check_functions(f_19,sequences,pair_limit_,matrix_,gVar1);
            f_20.fs = parasail_sg_qb_de_trace_sse41_functions;
            f_20.name = "parasail_sg_qb_de_trace_sse41";
            check_functions(f_20,sequences,pair_limit_,matrix_,gVar1);
            f_21.fs = parasail_sg_qe_db_trace_sse41_functions;
            f_21.name = "parasail_sg_qe_db_trace_sse41";
            check_functions(f_21,sequences,pair_limit_,matrix_,gVar1);
            f_22.fs = parasail_sg_qb_db_trace_sse41_functions;
            f_22.name = "parasail_sg_qb_db_trace_sse41";
            check_functions(f_22,sequences,pair_limit_,matrix_,gVar1);
            f_23.fs = parasail_sg_qe_de_trace_sse41_functions;
            f_23.name = "parasail_sg_qe_de_trace_sse41";
            check_functions(f_23,sequences,pair_limit_,matrix_,gVar1);
          }
          if (bVar19) {
            f_24.fs = parasail_sw_trace_sse41_functions;
            f_24.name = "parasail_sw_trace_sse41";
            check_functions(f_24,sequences,pair_limit_,matrix_,
                            (gap_score_t)((local_80 << 0x20) + uVar12));
          }
        }
        if ((bVar15) && (iVar5 = parasail_can_use_avx2(), bVar2 && iVar5 != 0)) {
          if (bVar17) {
            f_25.fs = parasail_nw_trace_avx2_functions;
            f_25.name = "parasail_nw_trace_avx2";
            check_functions(f_25,sequences,pair_limit_,matrix_,
                            (gap_score_t)((local_80 << 0x20) + uVar12));
          }
          if (bVar18) {
            gVar1 = (gap_score_t)((local_80 << 0x20) + uVar12);
            f_26.fs = parasail_sg_trace_avx2_functions;
            f_26.name = "parasail_sg_trace_avx2";
            check_functions(f_26,sequences,pair_limit_,matrix_,gVar1);
            f_27.fs = parasail_sg_qb_trace_avx2_functions;
            f_27.name = "parasail_sg_qb_trace_avx2";
            check_functions(f_27,sequences,pair_limit_,matrix_,gVar1);
            f_28.fs = parasail_sg_qe_trace_avx2_functions;
            f_28.name = "parasail_sg_qe_trace_avx2";
            check_functions(f_28,sequences,pair_limit_,matrix_,gVar1);
            f_29.fs = parasail_sg_qx_trace_avx2_functions;
            f_29.name = "parasail_sg_qx_trace_avx2";
            check_functions(f_29,sequences,pair_limit_,matrix_,gVar1);
            f_30.fs = parasail_sg_db_trace_avx2_functions;
            f_30.name = "parasail_sg_db_trace_avx2";
            check_functions(f_30,sequences,pair_limit_,matrix_,gVar1);
            f_31.fs = parasail_sg_de_trace_avx2_functions;
            f_31.name = "parasail_sg_de_trace_avx2";
            check_functions(f_31,sequences,pair_limit_,matrix_,gVar1);
            f_32.fs = parasail_sg_dx_trace_avx2_functions;
            f_32.name = "parasail_sg_dx_trace_avx2";
            check_functions(f_32,sequences,pair_limit_,matrix_,gVar1);
            f_33.fs = parasail_sg_qb_de_trace_avx2_functions;
            f_33.name = "parasail_sg_qb_de_trace_avx2";
            check_functions(f_33,sequences,pair_limit_,matrix_,gVar1);
            f_34.fs = parasail_sg_qe_db_trace_avx2_functions;
            f_34.name = "parasail_sg_qe_db_trace_avx2";
            check_functions(f_34,sequences,pair_limit_,matrix_,gVar1);
            f_35.fs = parasail_sg_qb_db_trace_avx2_functions;
            f_35.name = "parasail_sg_qb_db_trace_avx2";
            check_functions(f_35,sequences,pair_limit_,matrix_,gVar1);
            f_36.fs = parasail_sg_qe_de_trace_avx2_functions;
            f_36.name = "parasail_sg_qe_de_trace_avx2";
            check_functions(f_36,sequences,pair_limit_,matrix_,gVar1);
          }
          if (bVar19) {
            f_37.fs = parasail_sw_trace_avx2_functions;
            f_37.name = "parasail_sw_trace_avx2";
            check_functions(f_37,sequences,pair_limit_,matrix_,
                            (gap_score_t)((local_80 << 0x20) + uVar12));
          }
        }
        if (bVar2 && bVar16) {
          if (bVar17) {
            f_38.fs = parasail_nw_trace_disp_functions;
            f_38.name = "parasail_nw_trace_disp";
            check_functions(f_38,sequences,pair_limit_,matrix_,
                            (gap_score_t)((local_80 << 0x20) + uVar12));
          }
          if (bVar18) {
            gVar1 = (gap_score_t)((local_80 << 0x20) + uVar12);
            f_39.fs = parasail_sg_trace_disp_functions;
            f_39.name = "parasail_sg_trace_disp";
            check_functions(f_39,sequences,pair_limit_,matrix_,gVar1);
            f_40.fs = parasail_sg_qb_trace_disp_functions;
            f_40.name = "parasail_sg_qb_trace_disp";
            check_functions(f_40,sequences,pair_limit_,matrix_,gVar1);
            f_41.fs = parasail_sg_qe_trace_disp_functions;
            f_41.name = "parasail_sg_qe_trace_disp";
            check_functions(f_41,sequences,pair_limit_,matrix_,gVar1);
            f_42.fs = parasail_sg_qx_trace_disp_functions;
            f_42.name = "parasail_sg_qx_trace_disp";
            check_functions(f_42,sequences,pair_limit_,matrix_,gVar1);
            f_43.fs = parasail_sg_db_trace_disp_functions;
            f_43.name = "parasail_sg_db_trace_disp";
            check_functions(f_43,sequences,pair_limit_,matrix_,gVar1);
            f_44.fs = parasail_sg_de_trace_disp_functions;
            f_44.name = "parasail_sg_de_trace_disp";
            check_functions(f_44,sequences,pair_limit_,matrix_,gVar1);
            f_45.fs = parasail_sg_dx_trace_disp_functions;
            f_45.name = "parasail_sg_dx_trace_disp";
            check_functions(f_45,sequences,pair_limit_,matrix_,gVar1);
            f_46.fs = parasail_sg_qb_de_trace_disp_functions;
            f_46.name = "parasail_sg_qb_de_trace_disp";
            check_functions(f_46,sequences,pair_limit_,matrix_,gVar1);
            f_47.fs = parasail_sg_qe_db_trace_disp_functions;
            f_47.name = "parasail_sg_qe_db_trace_disp";
            check_functions(f_47,sequences,pair_limit_,matrix_,gVar1);
            f_48.fs = parasail_sg_qb_db_trace_disp_functions;
            f_48.name = "parasail_sg_qb_db_trace_disp";
            check_functions(f_48,sequences,pair_limit_,matrix_,gVar1);
            f_49.fs = parasail_sg_qe_de_trace_disp_functions;
            f_49.name = "parasail_sg_qe_de_trace_disp";
            check_functions(f_49,sequences,pair_limit_,matrix_,gVar1);
          }
          if (bVar19) {
            f_50.fs = parasail_sw_trace_disp_functions;
            f_50.name = "parasail_sw_trace_disp";
            check_functions(f_50,sequences,pair_limit_,matrix_,
                            (gap_score_t)(uVar12 | local_80 << 0x20));
          }
        }
        parasail_sequences_free(sequences);
        return 0;
      }
      matrix_ = (parasail_matrix_t *)parasail_matrix_lookup();
      if (matrix_ != (parasail_matrix_t *)0x0) goto LAB_0012f567;
      pcVar11 = "Specified substitution matrix not found.\n";
      sStack_90 = 0x29;
    }
  }
  fwrite(pcVar11,sStack_90,1,_stderr);
  goto LAB_0012fe07;
switchD_0012f336_caseD_6f:
  piVar7 = __errno_location();
  *piVar7 = 0;
  local_40 = strtol(_optarg,&endptr,10);
  if (*piVar7 != 0) {
    pcVar11 = "strtol gap.open";
LAB_0012fdce:
    perror(pcVar11);
LAB_0012fe07:
    exit(1);
  }
  goto LAB_0012f316;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned long seq_count = 0;
    unsigned long limit = 0;
    parasail_sequences_t *sequences = NULL;
    char *endptr = NULL;
    char *filename = NULL;
    int c = 0;
    int test_scores = 1;
    char *matrixname = NULL;
    const parasail_matrix_t *matrix = NULL;
    gap_score_t gap = {INT_MIN,INT_MIN};
    int do_sse2 = 1;
    int do_sse41 = 1;
    int do_avx2 = 1;
    int do_altivec = 1;
    int do_neon = 1;
    int do_disp = 1;
    int do_nw = 1;
    int do_sg = 1;
    int do_sw = 1;

    while ((c = getopt(argc, argv, "f:m:n:o:e:vSi:E")) != -1) {
        switch (c) {
            case 'f':
                filename = optarg;
                break;
            case 'm':
                matrixname = optarg;
                break;
            case 'n':
                errno = 0;
                seq_count = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol");
                    exit(1);
                }
                break;
            case 'o':
                errno = 0;
                gap.open = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol gap.open");
                    exit(1);
                }
                break;
            case 'e':
                errno = 0;
                gap.extend = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol gap.extend");
                    exit(1);
                }
                break;
            case 'v':
                verbose = 1;
                break;
            case 'E':
                exit_on_mismatch = 1;
                break;
            case 'S':
                test_scores = 0;
                break;
            case 'i':
                do_sse2 = (NULL == strstr(optarg, "sse2"));
                do_sse41 = (NULL == strstr(optarg, "sse41"));
                do_avx2 = (NULL == strstr(optarg, "avx2"));
                do_altivec = (NULL == strstr(optarg, "altivec"));
                do_neon = (NULL == strstr(optarg, "neon"));
                do_disp = (NULL == strstr(optarg, "disp"));
                do_nw = (NULL == strstr(optarg, "nw"));
                do_sg = (NULL == strstr(optarg, "sg"));
                do_sw = (NULL == strstr(optarg, "sw"));
                break;
            case '?':
                if (optopt == 'f' || optopt == 'n') {
                    fprintf(stderr,
                            "Option -%c requires an argument.\n",
                            optopt);
                }
                else if (isprint(optopt)) {
                    fprintf(stderr, "Unknown option `-%c'.\n",
                            optopt);
                }
                else {
                    fprintf(stderr,
                            "Unknown option character `\\x%x'.\n",
                            optopt);
                }
                exit(1);
            default:
                fprintf(stderr, "default case in getopt\n");
                exit(1);
        }
    }

    if (filename) {
        sequences = parasail_sequences_from_file(filename);
        if (0 == seq_count) {
            seq_count = sequences->l;
        }
    }
    else {
        fprintf(stderr, "no filename specified\n");
        exit(1);
    }

    /* select the matrix */
    if (matrixname) {
        matrix = parasail_matrix_lookup(matrixname);
        if (NULL == matrix) {
            fprintf(stderr, "Specified substitution matrix not found.\n");
            exit(1);
        }
    }

    limit = binomial_coefficient(seq_count, 2);
    printf("%lu choose 2 is %lu\n", seq_count, limit);

#if HAVE_SSE2
    if (do_sse2 && parasail_can_use_sse2()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_sse2, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_SSE41
    if (do_sse41 && parasail_can_use_sse41()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_sse41, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_AVX2
    if (do_avx2 && parasail_can_use_avx2()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_avx2, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_ALTIVEC
    if (do_altivec && parasail_can_use_altivec()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_altivec, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_NEON
    if (do_neon && parasail_can_use_neon()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_neon, sequences, limit, matrix, gap);
        }
    }
#endif

    if (do_disp) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_disp, sequences, limit, matrix, gap);
        }
    }

    parasail_sequences_free(sequences);

    return 0;
}